

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

void __thiscall
duckdb::MultiFileReader::BindOptions
          (MultiFileReader *this,MultiFileOptions *options,MultiFileList *files,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileReaderBindData *bind_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *l2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Rb_tree_header *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  iterator iVar10;
  element_type *peVar11;
  reference pvVar12;
  InternalException *pIVar13;
  BinderException *this_01;
  string *l1;
  long lVar14;
  MultiFileList *pMVar15;
  long lVar16;
  string *psVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  MultiFileListIterator __begin2;
  string error;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  MultiFileListIterator __end2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_partitions;
  allocator local_319;
  undefined8 local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  MultiFileOptions *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [2];
  undefined1 local_2d0 [16];
  undefined1 auStack_2c0 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *local_290;
  MultiFileReaderBindData *local_288;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  MultiFileListIterator local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_290 = (vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types;
  local_288 = bind_data;
  if (options->filename == true) {
    _Var9 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((names->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&options->filename_column);
    if (_Var9._M_current !=
        (names->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_2d0._0_8_ = auStack_2c0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d0,
                 "Option filename adds column \"%s\", but a column with this name is also in the file. Try setting a different name: filename=\'<filename column name>\'"
                 ,"");
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar2 = (options->filename_column)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + (options->filename_column)._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_01,(string *)local_2d0,&local_80);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_idx::optional_idx
              ((optional_idx *)local_2d0,
               (long)_Var9._M_current -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    (local_288->filename_idx).index = local_2d0._0_8_;
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>(local_290,&LogicalType::VARCHAR);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
               &options->filename_column);
  }
  if (options->hive_partitioning == true) {
    (*files->_vptr_MultiFileList[8])((string *)local_2d0,files,0);
    HivePartitioning::Parse
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_1b0,(string *)local_2d0);
    if ((pointer)auStack_2c0._24_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2c0._24_8_);
    }
    if ((MultiFileList *)local_2d0._0_8_ != (MultiFileList *)auStack_2c0) {
      operator_delete((void *)local_2d0._0_8_);
    }
    MultiFileListIterationHelper::MultiFileListIterationHelper
              ((MultiFileListIterationHelper *)local_2d0,files);
    pMVar15 = (MultiFileList *)local_2d0._0_8_;
    cVar7 = (**(code **)(*(long *)local_2d0._0_8_ + 0x28))(local_2d0._0_8_);
    if (cVar7 == '\0') {
      pMVar15 = (MultiFileList *)0x0;
    }
    MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
              ((MultiFileListIterator *)local_2d0,pMVar15);
    local_318 = (element_type *)files;
    local_308 = options;
    MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
              (&local_100,(MultiFileList *)0x0);
    p_Var4 = &local_1b0._M_impl.super__Rb_tree_header;
    local_280 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
    while (((MultiFileList *)local_2d0._0_8_ != local_100.file_list.ptr ||
           (local_2d0._8_8_ != local_100.file_scan_data.current_file_idx))) {
      HivePartitioning::Parse
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60,(string *)auStack_2c0);
      for (peVar11 = (element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
          peVar11 != (element_type *)p_Var4;
          peVar11 = (element_type *)::std::_Rb_tree_increment((_Rb_tree_node_base *)peVar11)) {
        iVar10 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&local_60,(key_type *)&(peVar11->alias).field_2);
        if ((_Rb_tree_header *)iVar10._M_node == &local_60._M_impl.super__Rb_tree_header) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,
                     "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found",
                     "");
          bVar8 = local_308->auto_detect_hive_partitioning;
          pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
          if (bVar8 == true) {
            ::std::operator+(&local_278,&local_250,"(hive partitioning was autodetected)");
            (*local_318->_vptr_ExtraTypeInfo[8])(&local_300,local_318,0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            if (local_300 == local_2f0) {
              local_1d0.field_2._8_4_ = local_2f0[0]._8_4_;
              local_1d0.field_2._12_4_ = local_2f0[0]._12_4_;
            }
            else {
              local_1d0._M_dataplus._M_p = (pointer)local_300;
            }
            local_1d0._M_string_length = local_2f8;
            local_2f8 = 0;
            local_2f0[0]._M_allocated_capacity._0_4_ =
                 (undefined4)local_2f0[0]._M_allocated_capacity & 0xffffff00;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            local_300 = local_2f0;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,auStack_2c0._0_8_,auStack_2c0._8_8_ + auStack_2c0._0_8_)
            ;
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            sVar1 = (peVar11->alias).field_2._M_allocated_capacity;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,sVar1,
                       *(long *)((long)&(peVar11->alias).field_2 + 8) + sVar1);
            InternalException::
            InternalException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (pIVar13,&local_278,&local_1d0,&local_120,&local_140);
            __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::string((string *)&local_278,local_250._M_dataplus._M_p,&local_319)
          ;
          (*local_318->_vptr_ExtraTypeInfo[8])(&local_300,local_318,0);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          if (local_300 == local_2f0) {
            local_1f0.field_2._8_4_ = local_2f0[0]._8_4_;
            local_1f0.field_2._12_4_ = local_2f0[0]._12_4_;
          }
          else {
            local_1f0._M_dataplus._M_p = (pointer)local_300;
          }
          local_1f0._M_string_length = local_2f8;
          local_2f8 = 0;
          local_2f0[0]._M_allocated_capacity._0_4_ =
               (undefined4)local_2f0[0]._M_allocated_capacity & 0xffffff00;
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          local_300 = local_2f0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,auStack_2c0._0_8_,auStack_2c0._8_8_ + auStack_2c0._0_8_);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          sVar1 = (peVar11->alias).field_2._M_allocated_capacity;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,sVar1,
                     *(long *)((long)&(peVar11->alias).field_2 + 8) + sVar1);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((BinderException *)pIVar13,&local_278,&local_1f0,&local_160,&local_180);
          __cxa_throw(pIVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (local_1b0._M_impl.super__Rb_tree_header._M_node_count !=
          local_60._M_impl.super__Rb_tree_header._M_node_count) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"Hive partition mismatch between file \"%s\" and \"%s\"","")
        ;
        bVar8 = local_308->auto_detect_hive_partitioning;
        pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
        if (bVar8 == true) {
          ::std::operator+(&local_278,&local_250,"(hive partitioning was autodetected)");
          (*local_318->_vptr_ExtraTypeInfo[8])(&local_300,local_318,0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          if (local_300 == local_2f0) {
            local_210.field_2._8_4_ = local_2f0[0]._8_4_;
            local_210.field_2._12_4_ = local_2f0[0]._12_4_;
          }
          else {
            local_210._M_dataplus._M_p = (pointer)local_300;
          }
          local_210._M_string_length = local_2f8;
          local_2f8 = 0;
          local_2f0[0]._M_allocated_capacity._0_4_ =
               (undefined4)local_2f0[0]._M_allocated_capacity & 0xffffff00;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_300 = local_2f0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,auStack_2c0._0_8_,auStack_2c0._8_8_ + auStack_2c0._0_8_);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar13,&local_278,&local_210,&local_a0);
          __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_278,local_250._M_dataplus._M_p,&local_319);
        (*local_318->_vptr_ExtraTypeInfo[8])(&local_300,local_318,0);
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        if (local_300 == local_2f0) {
          local_230.field_2._8_4_ = local_2f0[0]._8_4_;
          local_230.field_2._12_4_ = local_2f0[0]._12_4_;
        }
        else {
          local_230._M_dataplus._M_p = (pointer)local_300;
        }
        local_230._M_string_length = local_2f8;
        local_2f8 = 0;
        local_2f0[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_2f0[0]._M_allocated_capacity & 0xffffff00;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        local_300 = local_2f0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,auStack_2c0._0_8_,auStack_2c0._8_8_ + auStack_2c0._0_8_);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  ((BinderException *)pIVar13,&local_278,&local_230,&local_c0);
        __cxa_throw(pIVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
      MultiFileListIterationHelper::MultiFileListIterator::Next((MultiFileListIterator *)local_2d0);
    }
    if (local_100.current_file.extended_info.internal.
        super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_100.current_file.extended_info.internal.
                 super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.current_file.path._M_dataplus._M_p != &local_100.current_file.path.field_2) {
      operator_delete(local_100.current_file.path._M_dataplus._M_p);
    }
    if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2c0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_2c0 + 0x10)) {
      operator_delete((void *)auStack_2c0._0_8_);
    }
    if ((local_308->hive_types_schema)._M_h._M_element_count != 0) {
      MultiFileOptions::VerifyHiveTypesArePartitions
                (local_308,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1b0);
    }
    if ((_Rb_tree_header *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var4) {
      local_288 = (MultiFileReaderBindData *)&local_288->hive_partitioning_indexes;
      do {
        l2 = &(((element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left)->alias).
              field_2;
        l1 = *(string **)local_280;
        local_258 = *(string **)(local_280 + 8);
        lVar16 = (long)local_258 - (long)l1;
        local_318 = (element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0 < lVar16 >> 7) {
          lVar14 = (lVar16 >> 7) + 1;
          do {
            bVar8 = StringUtil::CIEquals(l1,(string *)l2);
            peVar11 = local_318;
            psVar17 = l1;
            if (bVar8) goto LAB_00ab37e1;
            bVar8 = StringUtil::CIEquals(l1 + 1,(string *)l2);
            peVar11 = local_318;
            psVar17 = l1 + 1;
            if (bVar8) goto LAB_00ab37e1;
            bVar8 = StringUtil::CIEquals(l1 + 2,(string *)l2);
            peVar11 = local_318;
            psVar17 = l1 + 2;
            if (bVar8) goto LAB_00ab37e1;
            bVar8 = StringUtil::CIEquals(l1 + 3,(string *)l2);
            peVar11 = local_318;
            psVar17 = l1 + 3;
            if (bVar8) goto LAB_00ab37e1;
            l1 = l1 + 4;
            lVar14 = lVar14 + -1;
            lVar16 = lVar16 + -0x80;
          } while (1 < lVar14);
        }
        lVar16 = lVar16 >> 5;
        peVar11 = local_318;
        if (lVar16 == 1) {
LAB_00ab37c8:
          bVar8 = StringUtil::CIEquals(l1,(string *)l2);
          psVar17 = local_258;
          if (bVar8) {
            psVar17 = l1;
          }
        }
        else if (lVar16 == 2) {
LAB_00ab379a:
          peVar11 = local_318;
          bVar8 = StringUtil::CIEquals(l1,(string *)l2);
          psVar17 = l1;
          if (!bVar8) {
            l1 = l1 + 1;
            goto LAB_00ab37c8;
          }
        }
        else {
          psVar17 = local_258;
          if ((lVar16 == 3) &&
             (bVar8 = StringUtil::CIEquals(l1,(string *)l2), peVar11 = local_318, psVar17 = l1,
             !bVar8)) {
            l1 = l1 + 1;
            goto LAB_00ab379a;
          }
        }
LAB_00ab37e1:
        pMVar15 = (MultiFileList *)((long)psVar17 - *(long *)local_280 >> 5);
        if (psVar17 == *(string **)(local_280 + 8)) {
          local_100.file_list.ptr = pMVar15;
          MultiFileOptions::GetHiveLogicalType((LogicalType *)local_2d0,local_308,(string *)l2);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
          emplace_back<duckdb::LogicalType>
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_290,
                     (LogicalType *)local_2d0);
          LogicalType::~LogicalType((LogicalType *)local_2d0);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    (local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2);
        }
        else {
          pMVar15 = (MultiFileList *)
                    NumericCastImpl<unsigned_long,_long,_false>::Convert((long)pMVar15);
          local_100.file_list.ptr = pMVar15;
          MultiFileOptions::GetHiveLogicalType((LogicalType *)local_2d0,local_308,(string *)l2);
          pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_290,(size_type)pMVar15);
          uVar6 = auStack_2c0._0_8_;
          uVar5 = local_2d0._8_8_;
          pvVar12->id_ = (LogicalTypeId)local_2d0[0];
          pvVar12->physical_type_ = local_2d0[1];
          uVar18 = *(undefined4 *)
                    &(pvVar12->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar19 = *(undefined4 *)
                    ((long)&(pvVar12->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          peVar3 = (pvVar12->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar20 = *(undefined4 *)
                    &(pvVar12->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar21 = *(undefined4 *)
                    ((long)&(pvVar12->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar12->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar12->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2d0._8_8_ = 0;
          auStack_2c0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pvVar12->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pvVar12->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar5;
          (pvVar12->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_318 = peVar3;
            uStack_310 = uVar20;
            uStack_30c = uVar21;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            uVar18 = (undefined4)local_318;
            uVar19 = local_318._4_4_;
            uVar20 = uStack_310;
            uVar21 = uStack_30c;
          }
          uVar5 = auStack_2c0._0_8_;
          local_2d0._12_4_ = uVar19;
          local_2d0._8_4_ = uVar18;
          auStack_2c0._4_4_ = uVar21;
          auStack_2c0._0_4_ = uVar20;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
          }
          LogicalType::~LogicalType((LogicalType *)local_2d0);
        }
        ::std::vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&>
                  ((vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>
                    *)local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2,
                   (unsigned_long *)&local_100);
        local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)peVar11);
      } while ((_Rb_tree_header *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left !=
               p_Var4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1b0);
  }
  return;
}

Assistant:

void MultiFileReader::BindOptions(MultiFileOptions &options, MultiFileList &files, vector<LogicalType> &return_types,
                                  vector<string> &names, MultiFileReaderBindData &bind_data) {
	// Add generated constant column for filename
	if (options.filename) {
		if (std::find(names.begin(), names.end(), options.filename_column) != names.end()) {
			throw BinderException("Option filename adds column \"%s\", but a column with this name is also in the "
			                      "file. Try setting a different name: filename='<filename column name>'",
			                      options.filename_column);
		}
		bind_data.filename_idx = names.size();
		return_types.emplace_back(LogicalType::VARCHAR);
		names.emplace_back(options.filename_column);
	}

	// Add generated constant columns from hive partitioning scheme
	if (options.hive_partitioning) {
		D_ASSERT(files.GetExpandResult() != FileExpandResult::NO_FILES);
		auto partitions = HivePartitioning::Parse(files.GetFirstFile().path);
		// verify that all files have the same hive partitioning scheme
		for (const auto &file : files.Files()) {
			auto file_partitions = HivePartitioning::Parse(file.path);
			for (auto &part_info : partitions) {
				if (file_partitions.find(part_info.first) == file_partitions.end()) {
					string error = "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found";
					if (options.auto_detect_hive_partitioning == true) {
						throw InternalException(error + "(hive partitioning was autodetected)",
						                        files.GetFirstFile().path, file.path, part_info.first);
					}
					throw BinderException(error.c_str(), files.GetFirstFile().path, file.path, part_info.first);
				}
			}
			if (partitions.size() != file_partitions.size()) {
				string error_msg = "Hive partition mismatch between file \"%s\" and \"%s\"";
				if (options.auto_detect_hive_partitioning == true) {
					throw InternalException(error_msg + "(hive partitioning was autodetected)",
					                        files.GetFirstFile().path, file.path);
				}
				throw BinderException(error_msg.c_str(), files.GetFirstFile().path, file.path);
			}
		}

		if (!options.hive_types_schema.empty()) {
			// verify that all hive_types are existing partitions
			options.VerifyHiveTypesArePartitions(partitions);
		}

		for (auto &part : partitions) {
			idx_t hive_partitioning_index;
			auto lookup = std::find_if(names.begin(), names.end(), [&](const string &col_name) {
				return StringUtil::CIEquals(col_name, part.first);
			});
			if (lookup != names.end()) {
				// hive partitioning column also exists in file - override
				auto idx = NumericCast<idx_t>(lookup - names.begin());
				hive_partitioning_index = idx;
				return_types[idx] = options.GetHiveLogicalType(part.first);
			} else {
				// hive partitioning column does not exist in file - add a new column containing the key
				hive_partitioning_index = names.size();
				return_types.emplace_back(options.GetHiveLogicalType(part.first));
				names.emplace_back(part.first);
			}
			bind_data.hive_partitioning_indexes.emplace_back(part.first, hive_partitioning_index);
		}
	}
}